

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.hpp
# Opt level: O3

void __thiscall
pico_tree::
kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<std::array<float,784ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,float>>>
          (kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
           *this,long point,ulong max_leaves_visited,
          search_nn<pico_tree::neighbor<int,_float>_> *visitor)

{
  scalar_type *psVar1;
  float *pfVar2;
  float *pfVar3;
  node_type *node;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  point<float,_784UL> p;
  float local_ce4;
  kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
  *local_ce0;
  ulong local_cd8;
  search_nn<pico_tree::neighbor<int,_float>_> *local_cd0;
  kd_tree_node_topological<int,_float> *local_cc8;
  undefined1 local_cc0 [40];
  pointer local_c98;
  pointer ppStack_c90;
  pointer local_c88;
  search_nn<pico_tree::neighbor<int,_float>_> *local_c78;
  point_type local_c70;
  
  lVar15 = *(long *)(this + 0x10);
  if (*(long *)(this + 0x18) != lVar15) {
    lVar13 = 0;
    uVar14 = 0;
    local_ce0 = this;
    local_cd8 = max_leaves_visited;
    local_cd0 = visitor;
    do {
      lVar11 = uVar14 * 0x2520 + lVar15;
      memset(&local_c70,0,0xc40);
      fVar16 = 0.0;
      lVar10 = 0;
      do {
        fVar16 = fVar16 + *(float *)(lVar15 + lVar13 + lVar10 * 4) * *(float *)(point + lVar10 * 4);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x310);
      fVar16 = fVar16 * -2.0;
      lVar10 = 0;
      do {
        pfVar2 = (float *)(point + lVar10 * 4);
        fVar4 = pfVar2[1];
        fVar5 = pfVar2[2];
        fVar6 = pfVar2[3];
        pfVar3 = (float *)(lVar15 + lVar13 + lVar10 * 4);
        fVar7 = pfVar3[1];
        fVar8 = pfVar3[2];
        fVar9 = pfVar3[3];
        local_c70.elems_._M_elems[lVar10] = *pfVar3 * fVar16 + *pfVar2;
        local_c70.elems_._M_elems[lVar10 + 1] = fVar7 * fVar16 + fVar4;
        local_c70.elems_._M_elems[lVar10 + 2] = fVar8 * fVar16 + fVar5;
        local_c70.elems_._M_elems[lVar10 + 3] = fVar9 * fVar16 + fVar6;
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x310);
      local_cc0._0_8_ = lVar11 + 0xc40;
      local_cc0._16_8_ = lVar11 + 0xc60;
      local_cc0._24_8_ = &local_c70;
      local_cc0._32_8_ = local_cd8;
      local_c98 = (pointer)0x0;
      ppStack_c90 = (pointer)0x0;
      local_c88 = (pointer)0x0;
      local_c78 = local_cd0;
      local_cc8 = *(kd_tree_node_topological<int,_float> **)(lVar11 + 0x2518);
      local_ce4 = 0.0;
      ::std::
      priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
      ::emplace<float,pico_tree::internal::kd_tree_node_topological<int,float>const*const&>
                ((priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
                  *)&local_c98,&local_ce4,&local_cc8);
      if (local_c98 != ppStack_c90) {
        uVar12 = 0xffffffffffffffff;
        do {
          uVar12 = uVar12 + 1;
          if ((ulong)local_cc0._32_8_ <= uVar12) goto LAB_0010787f;
          fVar16 = local_c98->first;
          psVar1 = &local_c78->nn_->distance;
          if (*psVar1 <= fVar16 && fVar16 != *psVar1) goto LAB_0010787f;
          node = local_c98->second;
          std::
          priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
          ::pop((priority_queue<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::vector<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>,_std::greater<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
                 *)&local_c98);
          internal::
          priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
          ::search_nearest((priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                            *)local_cc0,node,fVar16);
        } while (local_c98 != ppStack_c90);
      }
      if (local_c98 != (pointer)0x0) {
LAB_0010787f:
        operator_delete(local_c98,(long)local_c88 - (long)local_c98);
      }
      uVar14 = uVar14 + 1;
      lVar15 = *(long *)(local_ce0 + 0x10);
      lVar13 = lVar13 + 0x2520;
    } while (uVar14 < (ulong)((*(long *)(local_ce0 + 0x18) - lVar15 >> 5) * 0x3a9ce01b951e2b19));
  }
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point,
      size_type max_leaves_visited,
      Visitor_& visitor,
      euclidean_space_tag) const {
    // Range based for loop (rightfully) results in a warning that shouldn't be
    // needed if the user creates the forest with at least a single tree.
    for (std::size_t i = 0; i < data_.size(); ++i) {
      auto p = data_[i].rotate_point(point);
      using point_wrapper_type = internal::point_wrapper<decltype(p)>;
      point_wrapper_type point_wrapper(p);
      internal::priority_search_nearest_euclidean<
          typename rkd_tree_data_type::space_wrapper_type,
          Metric_,
          point_wrapper_type,
          Visitor_,
          index_type>(
          typename rkd_tree_data_type::space_wrapper_type(data_[i].space),
          metric_,
          data_[i].tree.indices,
          point_wrapper,
          max_leaves_visited,
          visitor)(data_[i].tree.root_node);
    }
  }